

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_setenv.cpp
# Opt level: O1

void SetAndGetEnv(int iRoutineID)

{
  uint __errnum;
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  char sBuf [128];
  char acStack_98 [128];
  
  printf("routineid %d begin\n");
  poll((pollfd *)0x0,0,500);
  sprintf(acStack_98,"cgi_routine_%d",iRoutineID);
  uVar1 = setenv("CGINAME",acStack_98,1);
  if (uVar1 == 0) {
    printf("routineid %d set env CGINAME %s\n",iRoutineID,acStack_98);
    poll((pollfd *)0x0,0,500);
    pcVar3 = getenv("CGINAME");
    if (pcVar3 == (char *)0x0) {
      puVar2 = (uint *)__errno_location();
      uVar1 = *puVar2;
      pcVar3 = strerror(uVar1);
      printf("%s:%d get env err errno %d %s\n","SetAndGetEnv",0x3a,(ulong)uVar1,pcVar3);
    }
    else {
      printf("routineid %d get env CGINAME %s\n",iRoutineID,pcVar3);
    }
  }
  else {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    printf("%s:%d set env err ret %d errno %d %s\n","SetAndGetEnv",0x2f,(ulong)uVar1,(ulong)__errnum
           ,pcVar3);
  }
  return;
}

Assistant:

void SetAndGetEnv(int iRoutineID)
{
	printf("routineid %d begin\n", iRoutineID);

	//use poll as sleep
	poll(NULL, 0, 500);

	char sBuf[128];
	sprintf(sBuf, "cgi_routine_%d", iRoutineID);
	int ret = setenv("CGINAME", sBuf, 1);
	if (ret)
	{
		printf("%s:%d set env err ret %d errno %d %s\n", __func__, __LINE__,
				ret, errno, strerror(errno));
		return;
	}
	printf("routineid %d set env CGINAME %s\n", iRoutineID, sBuf);

	poll(NULL, 0, 500);

	char* env = getenv("CGINAME");
	if (!env)
	{
		printf("%s:%d get env err errno %d %s\n", __func__, __LINE__,
				errno, strerror(errno));
		return;
	}
	printf("routineid %d get env CGINAME %s\n", iRoutineID, env);
}